

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indented_writer.h
# Opt level: O3

void __thiscall ctemplate::IndentedWriter::DoWrite(IndentedWriter *this,string *line)

{
  LineState LVar1;
  
  if (this->line_state_ == AT_BEGINNING) {
    IndentLine(this);
  }
  std::__cxx11::string::_M_append((char *)this->out_,(ulong)(line->_M_dataplus)._M_p);
  if (line->_M_string_length == 0) {
    LVar1 = MID_LINE;
  }
  else {
    LVar1 = (LineState)((line->_M_dataplus)._M_p[line->_M_string_length - 1] != '\n');
  }
  this->line_state_ = LVar1;
  return;
}

Assistant:

void DoWrite(const string& line) {
    if (line_state_ == AT_BEGINNING) {
      IndentLine();
    }
    out_->append(line);
    if (EndsWithNewline(line)) {
      line_state_ = AT_BEGINNING;
    } else {
      line_state_ = MID_LINE;
    }
  }